

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assignment.h
# Opt level: O0

ptr<Value> __thiscall Assignment::evaluate(Assignment *this,Environment *env)

{
  Scope scope;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  element_type *peVar3;
  ThrowPacket *this_00;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar7;
  shared_ptr<Value> local_b8;
  shared_ptr<Value> local_a8;
  undefined1 local_98 [8];
  ptr<Value> newValue;
  ptr<Value> currValue;
  string local_70;
  ptr<Value> local_50 [2];
  undefined1 local_30 [8];
  ptr<Symbol> symbol;
  Environment *env_local;
  Assignment *this_local;
  
  symbol.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX;
  std::dynamic_pointer_cast<Symbol,Expression>((shared_ptr<Expression> *)local_30);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  _Var1 = symbol.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (bVar2) {
    peVar3 = std::__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    bVar2 = Environment::hasSymbol((Environment *)_Var1._M_pi,&peVar3->name);
    _Var1 = symbol.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if (bVar2) {
      std::__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_30);
      Environment::getValue
                ((Environment *)
                 &newValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Identifier *)_Var1._M_pi);
      peVar4 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(env->symbols)._M_h._M_element_count);
      (**peVar4->_vptr_Expression)
                (local_98,peVar4,
                 symbol.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      bVar2 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)&(env->symbols)._M_h._M_rehash_policy._M_next_resize);
      if (bVar2) {
        peVar5 = std::__shared_ptr_access<Operation,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Operation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(env->symbols)._M_h._M_rehash_policy._M_next_resize);
        (*peVar5->_vptr_Operation[6])
                  (&local_a8,peVar5,
                   &newValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   local_98);
        std::shared_ptr<Value>::operator=((shared_ptr<Value> *)local_98,&local_a8);
        std::shared_ptr<Value>::~shared_ptr(&local_a8);
      }
      peVar3 = std::__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_30);
      peVar6 = std::__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_30);
      scope = peVar6->scope;
      std::shared_ptr<Value>::shared_ptr(&local_b8,(shared_ptr<Value> *)local_98);
      peVar6 = std::__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_30);
      Environment::putValue
                ((Environment *)
                 symbol.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
                 &peVar3->name,scope,&local_b8,(bool)(peVar6->constant & 1));
      std::shared_ptr<Value>::~shared_ptr(&local_b8);
      std::shared_ptr<Value>::shared_ptr((shared_ptr<Value> *)this,(nullptr_t)0x0);
      std::shared_ptr<Value>::~shared_ptr((shared_ptr<Value> *)local_98);
      std::shared_ptr<Value>::~shared_ptr
                ((shared_ptr<Value> *)
                 &newValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::shared_ptr<Symbol>::~shared_ptr((shared_ptr<Symbol> *)local_30);
      pVar7.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      pVar7.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
      return (ptr<Value>)pVar7.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  currValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 1;
  this_00 = (ThrowPacket *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"The member is not defined",
             (allocator<char> *)
             ((long)&currValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  ExceptionObjects::undefined((ExceptionObjects *)local_50,&local_70);
  ThrowPacket::ThrowPacket(this_00,local_50);
  currValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0;
  __cxa_throw(this_00,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        ptr<Symbol> symbol = std::dynamic_pointer_cast<Symbol>(leftExpression);

        if(!symbol || !(env -> hasSymbol(symbol -> name)))
            throw ThrowPacket(ExceptionObjects::undefined("The member is not defined"));

        ptr<Value> currValue = env -> getValue(symbol -> name);
        ptr<Value> newValue = rightExpression -> evaluate(env);

        if(operation)
            newValue = operation -> getResult(currValue, newValue);

        env -> putValue(symbol -> name, symbol -> scope, newValue, symbol -> constant);
        return nullptr;
    }